

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osMutex.cpp
# Opt level: O3

void osMutex::StaticInit(void)

{
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_c;
  
  if (StaticInit()::IsInitialized == '\0') {
    StaticInit()::IsInitialized = '\x01';
    pthread_mutexattr_init(&local_c);
    pthread_mutexattr_settype(&local_c,1);
    pthread_mutex_init((pthread_mutex_t *)&MutexListMutex,&local_c);
  }
  return;
}

Assistant:

void osMutex::StaticInit()
{
    static bool IsInitialized = false;
    if (!IsInitialized)
    {
        IsInitialized = true;
#ifdef __linux__
        pthread_mutexattr_t attr;
        pthread_mutexattr_init(&attr);
        pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
        pthread_mutex_init(&MutexListMutex, &attr);
#endif
    }
}